

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool print_array(cJSON *item,printbuffer *output_buffer)

{
  cJSON_bool cVar1;
  int iVar2;
  uchar *puVar3;
  cJSON *local_38;
  cJSON *current_element;
  size_t length;
  uchar *output_pointer;
  printbuffer *output_buffer_local;
  cJSON *item_local;
  
  local_38 = item->child;
  if (output_buffer == (printbuffer *)0x0) {
    item_local._4_4_ = 0;
  }
  else {
    puVar3 = ensure(output_buffer,1);
    if (puVar3 == (uchar *)0x0) {
      item_local._4_4_ = 0;
    }
    else {
      *puVar3 = '[';
      output_buffer->offset = output_buffer->offset + 1;
      output_buffer->depth = output_buffer->depth + 1;
      for (; local_38 != (cJSON *)0x0; local_38 = local_38->next) {
        cVar1 = print_value(local_38,output_buffer);
        if (cVar1 == 0) {
          return 0;
        }
        update_offset(output_buffer);
        if (local_38->next != (cJSON *)0x0) {
          iVar2 = 1;
          if (output_buffer->format != 0) {
            iVar2 = 2;
          }
          puVar3 = ensure(output_buffer,(long)iVar2 + 1);
          if (puVar3 == (uchar *)0x0) {
            return 0;
          }
          *puVar3 = ',';
          length = (size_t)(puVar3 + 1);
          if (output_buffer->format != 0) {
            length = (size_t)(puVar3 + 2);
            puVar3[1] = ' ';
          }
          *(undefined1 *)length = 0;
          output_buffer->offset = (long)iVar2 + output_buffer->offset;
        }
      }
      puVar3 = ensure(output_buffer,2);
      if (puVar3 == (uchar *)0x0) {
        item_local._4_4_ = 0;
      }
      else {
        *puVar3 = ']';
        puVar3[1] = '\0';
        output_buffer->depth = output_buffer->depth - 1;
        item_local._4_4_ = 1;
      }
    }
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool print_array(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    size_t length = 0;
    cJSON *current_element = item->child;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* Compose the output array. */
    /* opening square bracket */
    output_pointer = ensure(output_buffer, 1);
    if (output_pointer == NULL)
    {
        return false;
    }

    *output_pointer = '[';
    output_buffer->offset++;
    output_buffer->depth++;

    while (current_element != NULL)
    {
        if (!print_value(current_element, output_buffer))
        {
            return false;
        }
        update_offset(output_buffer);
        if (current_element->next)
        {
            length = (size_t) (output_buffer->format ? 2 : 1);
            output_pointer = ensure(output_buffer, length + 1);
            if (output_pointer == NULL)
            {
                return false;
            }
            *output_pointer++ = ',';
            if(output_buffer->format)
            {
                *output_pointer++ = ' ';
            }
            *output_pointer = '\0';
            output_buffer->offset += length;
        }
        current_element = current_element->next;
    }

    output_pointer = ensure(output_buffer, 2);
    if (output_pointer == NULL)
    {
        return false;
    }
    *output_pointer++ = ']';
    *output_pointer = '\0';
    output_buffer->depth--;

    return true;
}